

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_gsnlist(CHAR_DATA *ch,char *argument)

{
  BUFFER *buffer;
  BUFFER *output;
  char buf [4608];
  int col;
  int sn;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  char local_1218 [8];
  char *in_stack_ffffffffffffedf0;
  BUFFER *in_stack_ffffffffffffedf8;
  int local_18;
  uint local_14;
  
  local_18 = 0;
  buffer = new_buf();
  for (local_14 = 0; (int)local_14 < 800; local_14 = local_14 + 1) {
    if (skill_table[(int)local_14].name != (char *)0x0) {
      sprintf(local_1218,"%-18s %3d  ",skill_table[(int)local_14].name,(ulong)local_14);
      add_buf(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
      local_18 = local_18 + 1;
      if (local_18 % 3 == 0) {
        add_buf(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
      }
    }
  }
  buf_string(buffer);
  page_to_char((char *)buffer,in_stack_ffffffffffffedd8);
  free_buf((BUFFER *)0x59c493);
  return;
}

Assistant:

void do_gsnlist(CHAR_DATA *ch, char *argument)
{
	int sn, col = 0;
	char buf[MSL];
	BUFFER *output;

	output = new_buf();

	for (sn = 0; sn < MAX_SKILL; sn++)
	{
		if (skill_table[sn].name == nullptr)
			continue;

		sprintf(buf, "%-18s %3d  ", skill_table[sn].name, sn);
		add_buf(output, buf);

		if (++col % 3 == 0)
			add_buf(output, "\n\r");
	}

	page_to_char(buf_string(output), ch);
	free_buf(output);
}